

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# test_read_truncated_filter.c
# Opt level: O3

void test_truncation(char *compression,_func_int_archive_ptr *set_compression,int can_prog)

{
  int iVar1;
  int iVar2;
  wchar_t wVar3;
  void *__ptr;
  void *buffer;
  archive *paVar4;
  archive_entry *entry;
  la_ssize_t lVar5;
  char *pcVar6;
  longlong v1;
  uint uVar7;
  ulong uVar8;
  archive_entry *ae;
  size_t used1;
  char path [16];
  archive_entry *local_58;
  ulong local_50;
  char local_48 [24];
  
  __ptr = malloc(2000000);
  assertion_assert("/workspace/llm4binary/github/license_all_cmakelists_1510/mmatuska[P]libarchive/libarchive/test/test_read_truncated_filter.c"
                   ,L'.',(uint)(__ptr != (void *)0x0),"NULL != (buff = malloc(buffsize))",
                   (void *)0x0);
  if (__ptr == (void *)0x0) {
    return;
  }
  buffer = calloc(1,10000);
  assertion_assert("/workspace/llm4binary/github/license_all_cmakelists_1510/mmatuska[P]libarchive/libarchive/test/test_read_truncated_filter.c"
                   ,L'3',(uint)(buffer != (void *)0x0),"NULL != (data = malloc(datasize))",
                   (void *)0x0);
  if (buffer != (void *)0x0) {
    paVar4 = archive_write_new();
    assertion_assert("/workspace/llm4binary/github/license_all_cmakelists_1510/mmatuska[P]libarchive/libarchive/test/test_read_truncated_filter.c"
                     ,L'=',(uint)(paVar4 != (archive *)0x0),"(a = archive_write_new()) != NULL",
                     (void *)0x0);
    iVar1 = archive_write_set_format_ustar(paVar4);
    assertion_equal_int("/workspace/llm4binary/github/license_all_cmakelists_1510/mmatuska[P]libarchive/libarchive/test/test_read_truncated_filter.c"
                        ,L'>',0,"ARCHIVE_OK",(long)iVar1,"archive_write_set_format_ustar(a)",paVar4)
    ;
    iVar1 = archive_write_add_filter_compress(paVar4);
    assertion_equal_int("/workspace/llm4binary/github/license_all_cmakelists_1510/mmatuska[P]libarchive/libarchive/test/test_read_truncated_filter.c"
                        ,L'@',0,"ARCHIVE_OK",(long)iVar1,"archive_write_add_filter_compress(a)",
                        paVar4);
    iVar1 = (*set_compression)(paVar4);
    if (can_prog != 0 || iVar1 == 0) {
      iVar2 = archive_write_set_bytes_per_block(paVar4,10);
      assertion_equal_int("/workspace/llm4binary/github/license_all_cmakelists_1510/mmatuska[P]libarchive/libarchive/test/test_read_truncated_filter.c"
                          ,L'L',0,"ARCHIVE_OK",(long)iVar2,
                          "archive_write_set_bytes_per_block(a, 10)",paVar4);
      iVar2 = archive_write_open_memory(paVar4,__ptr,2000000,&local_50);
      assertion_equal_int("/workspace/llm4binary/github/license_all_cmakelists_1510/mmatuska[P]libarchive/libarchive/test/test_read_truncated_filter.c"
                          ,L'N',0,"ARCHIVE_OK",(long)iVar2,
                          "archive_write_open_memory(a, buff, buffsize, &used1)",paVar4);
      entry = archive_entry_new();
      local_58 = entry;
      assertion_assert("/workspace/llm4binary/github/license_all_cmakelists_1510/mmatuska[P]libarchive/libarchive/test/test_read_truncated_filter.c"
                       ,L'O',(uint)(entry != (archive_entry *)0x0),
                       "(ae = archive_entry_new()) != NULL",(void *)0x0);
      archive_entry_set_filetype(entry,0x8000);
      archive_entry_set_size(entry,10000);
      uVar8 = 0;
      do {
        snprintf(local_48,0x10,"%s%d",compression,uVar8);
        archive_entry_copy_pathname(entry,local_48);
        failure("%s",local_48);
        iVar2 = archive_write_header(paVar4,entry);
        wVar3 = assertion_equal_int("/workspace/llm4binary/github/license_all_cmakelists_1510/mmatuska[P]libarchive/libarchive/test/test_read_truncated_filter.c"
                                    ,L'W',0,"ARCHIVE_OK",(long)iVar2,"archive_write_header(a, ae)",
                                    paVar4);
        if (wVar3 == L'\0') {
LAB_001c44a0:
          archive_write_free(paVar4);
          free(buffer);
          goto LAB_001c4630;
        }
        fill_with_pseudorandom_data(buffer,10000);
        failure("%s",local_48);
        lVar5 = archive_write_data(paVar4,buffer,10000);
        wVar3 = assertion_equal_int("/workspace/llm4binary/github/license_all_cmakelists_1510/mmatuska[P]libarchive/libarchive/test/test_read_truncated_filter.c"
                                    ,L'`',10000,"datasize",lVar5,
                                    "archive_write_data(a, data, datasize)",paVar4);
        if (wVar3 == L'\0') goto LAB_001c44a0;
        uVar7 = (int)uVar8 + 1;
        uVar8 = (ulong)uVar7;
      } while (uVar7 != 100);
      archive_entry_free(entry);
      iVar2 = archive_write_close(paVar4);
      assertion_equal_int("/workspace/llm4binary/github/license_all_cmakelists_1510/mmatuska[P]libarchive/libarchive/test/test_read_truncated_filter.c"
                          ,L'h',0,"ARCHIVE_OK",(long)iVar2,"archive_write_close(a)",paVar4);
      iVar2 = archive_write_free(paVar4);
      assertion_equal_int("/workspace/llm4binary/github/license_all_cmakelists_1510/mmatuska[P]libarchive/libarchive/test/test_read_truncated_filter.c"
                          ,L'i',0,"ARCHIVE_OK",(long)iVar2,"archive_write_free(a)",(void *)0x0);
      paVar4 = archive_read_new();
      assertion_assert("/workspace/llm4binary/github/license_all_cmakelists_1510/mmatuska[P]libarchive/libarchive/test/test_read_truncated_filter.c"
                       ,L'k',(uint)(paVar4 != (archive *)0x0),"(a = archive_read_new()) != NULL",
                       (void *)0x0);
      iVar2 = archive_read_support_format_all(paVar4);
      assertion_equal_int("/workspace/llm4binary/github/license_all_cmakelists_1510/mmatuska[P]libarchive/libarchive/test/test_read_truncated_filter.c"
                          ,L'l',0,"ARCHIVE_OK",(long)iVar2,"archive_read_support_format_all(a)",
                          paVar4);
      iVar2 = archive_read_support_filter_all(paVar4);
      assertion_equal_int("/workspace/llm4binary/github/license_all_cmakelists_1510/mmatuska[P]libarchive/libarchive/test/test_read_truncated_filter.c"
                          ,L'm',0,"ARCHIVE_OK",(long)iVar2,"archive_read_support_filter_all(a)",
                          paVar4);
      iVar2 = archive_read_open_memory(paVar4,__ptr,local_50 - (local_50 >> 6));
      if (iVar2 == 0) {
        uVar7 = 0;
        do {
          iVar2 = archive_read_next_header(paVar4,&local_58);
          if (iVar2 != 0) {
            wVar3 = L'z';
LAB_001c456d:
            failure("Should have non-NULL error message for %s",compression);
            pcVar6 = archive_error_string(paVar4);
            assertion_assert("/workspace/llm4binary/github/license_all_cmakelists_1510/mmatuska[P]libarchive/libarchive/test/test_read_truncated_filter.c"
                             ,wVar3,(uint)(pcVar6 != (char *)0x0),"NULL != archive_error_string(a)",
                             (void *)0x0);
            break;
          }
          snprintf(local_48,0x10,"%s%d",compression,(ulong)uVar7);
          pcVar6 = archive_entry_pathname(local_58);
          assertion_equal_string
                    ("/workspace/llm4binary/github/license_all_cmakelists_1510/mmatuska[P]libarchive/libarchive/test/test_read_truncated_filter.c"
                     ,L'~',local_48,"path",pcVar6,"archive_entry_pathname(ae)",(void *)0x0,L'\0');
          lVar5 = archive_read_data(paVar4,buffer,10000);
          if (lVar5 != 10000) {
            wVar3 = L'\x82';
            goto LAB_001c456d;
          }
          uVar7 = uVar7 + 1;
        } while (uVar7 != 100);
        v1 = -0x14;
        if (iVar1 != -0x14 || can_prog == 0) {
          v1 = 0;
        }
        iVar1 = archive_read_close(paVar4);
        assertion_equal_int("/workspace/llm4binary/github/license_all_cmakelists_1510/mmatuska[P]libarchive/libarchive/test/test_read_truncated_filter.c"
                            ,L'\x87',v1,"(use_prog)?ARCHIVE_WARN:ARCHIVE_OK",(long)iVar1,
                            "archive_read_close(a)",paVar4);
        iVar1 = archive_read_free(paVar4);
        assertion_equal_int("/workspace/llm4binary/github/license_all_cmakelists_1510/mmatuska[P]libarchive/libarchive/test/test_read_truncated_filter.c"
                            ,L'\x88',0,"ARCHIVE_OK",(long)iVar1,"archive_read_free(a)",(void *)0x0);
      }
      else {
        pcVar6 = archive_error_string(paVar4);
        assertion_equal_string
                  ("/workspace/llm4binary/github/license_all_cmakelists_1510/mmatuska[P]libarchive/libarchive/test/test_read_truncated_filter.c"
                   ,L'r',"truncated bzip2 input","\"truncated bzip2 input\"",pcVar6,
                   "archive_error_string(a)",paVar4,L'\0');
      }
      free(buffer);
LAB_001c4630:
      free(__ptr);
      return;
    }
    skipping_setup("/workspace/llm4binary/github/license_all_cmakelists_1510/mmatuska[P]libarchive/libarchive/test/test_read_truncated_filter.c"
                   ,L'C');
    test_skipping("%s writing not supported on this platform",compression);
    iVar1 = archive_write_free(paVar4);
    assertion_equal_int("/workspace/llm4binary/github/license_all_cmakelists_1510/mmatuska[P]libarchive/libarchive/test/test_read_truncated_filter.c"
                        ,L'E',0,"ARCHIVE_OK",(long)iVar1,"archive_write_free(a)",(void *)0x0);
    free(__ptr);
    __ptr = buffer;
  }
  free(__ptr);
  return;
}

Assistant:

static void
test_truncation(const char *compression,
    int (*set_compression)(struct archive *), int can_prog)
{
	struct archive_entry *ae;
	struct archive* a;
	char path[16];
	char *buff, *data;
	size_t buffsize, datasize, used1;
	int i, r, use_prog;

	buffsize = 2000000;
	assert(NULL != (buff = malloc(buffsize)));
	if (buff == NULL)
		return;

	datasize = 10000;
	assert(NULL != (data = malloc(datasize)));
	if (data == NULL) {
		free(buff);
		return;
	}
	memset(data, 0, datasize);

	/*
	 * Write a bunch of files with semi-random data.
	 */
	assert((a = archive_write_new()) != NULL);
	assertEqualIntA(a, ARCHIVE_OK, archive_write_set_format_ustar(a));
	assertEqualIntA(a, ARCHIVE_OK,
	    archive_write_add_filter_compress(a));
	r = (*set_compression)(a);
	if (r != ARCHIVE_OK && !can_prog) {
		skipping("%s writing not supported on this platform",
		    compression);
		assertEqualInt(ARCHIVE_OK, archive_write_free(a));
		free(buff);
		free(data);
		return;
	}
	use_prog = (r == ARCHIVE_WARN && can_prog);
	assertEqualIntA(a, ARCHIVE_OK,
	    archive_write_set_bytes_per_block(a, 10));
	assertEqualIntA(a, ARCHIVE_OK,
	    archive_write_open_memory(a, buff, buffsize, &used1));
	assert((ae = archive_entry_new()) != NULL);
	archive_entry_set_filetype(ae, AE_IFREG);
	archive_entry_set_size(ae, datasize);
	for (i = 0; i < 100; i++) {
		snprintf(path, sizeof(path), "%s%d", compression, i);
		archive_entry_copy_pathname(ae, path);
		failure("%s", path);
		if (!assertEqualIntA(a, ARCHIVE_OK,
		    archive_write_header(a, ae))) {
			archive_write_free(a);
			free(data);
			free(buff);
			return;
		}
		fill_with_pseudorandom_data(data, datasize);
		failure("%s", path);
		if (!assertEqualIntA(a, datasize,
		    archive_write_data(a, data, datasize))) {
			archive_write_free(a);
			free(data);
			free(buff);
			return;
		}
	}
	archive_entry_free(ae);
	assertEqualIntA(a, ARCHIVE_OK, archive_write_close(a));
	assertEqualInt(ARCHIVE_OK, archive_write_free(a));

	assert((a = archive_read_new()) != NULL);
	assertEqualIntA(a, ARCHIVE_OK, archive_read_support_format_all(a));
	assertEqualIntA(a, ARCHIVE_OK, archive_read_support_filter_all(a));

	r = archive_read_open_memory(a, buff, used1 - used1/64);
	if (r != ARCHIVE_OK) {
		assertEqualStringA(a, "truncated bzip2 input",
		    archive_error_string(a));
		    goto out;
	}

	for (i = 0; i < 100; i++) {
		if (ARCHIVE_OK != archive_read_next_header(a, &ae)) {
			failure("Should have non-NULL error message for %s",
			    compression);
			assert(NULL != archive_error_string(a));
			break;
		}
		snprintf(path, sizeof(path), "%s%d", compression, i);
		assertEqualString(path, archive_entry_pathname(ae));
		if (datasize != (size_t)archive_read_data(a, data, datasize)) {
			failure("Should have non-NULL error message for %s",
			    compression);
			assert(NULL != archive_error_string(a));
			break;
		}
	}
	assertEqualIntA(a, (use_prog)?ARCHIVE_WARN:ARCHIVE_OK,
	    archive_read_close(a));
	assertEqualInt(ARCHIVE_OK, archive_read_free(a));

out:
	free(data);
	free(buff);
}